

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_error_manager.hpp
# Opt level: O0

void __thiscall duckdb::TaskErrorManager::ThrowException(TaskErrorManager *this)

{
  value_type *entry;
  lock_guard<std::mutex> elock;
  mutex_type *in_stack_ffffffffffffff88;
  vector<duckdb::ErrorData,_true> *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [32];
  string *in_stack_ffffffffffffffd8;
  ErrorData *in_stack_ffffffffffffffe0;
  
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  vector<duckdb::ErrorData,_true>::operator[]
            (in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48,anon_var_dwarf_3eb64fd + 9,&local_49);
  ErrorData::Throw(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
}

Assistant:

void ThrowException() {
		lock_guard<mutex> elock(error_lock);
		D_ASSERT(!exceptions.empty());
		auto &entry = exceptions[0];
		entry.Throw();
	}